

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

void cmsys::SystemTools::AddKeepPath(string *dir)

{
  string cdir;
  allocator local_69;
  string local_68;
  string local_48;
  string local_28;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  CollapseFullPath(&local_48,dir);
  std::__cxx11::string::string((string *)&local_28,local_48._M_dataplus._M_p,&local_69);
  Realpath(&local_28,&local_68,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  AddTranslationPath(&local_68,dir);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void SystemTools::AddKeepPath(const kwsys_stl::string& dir)
{
  kwsys_stl::string cdir;
  Realpath(SystemTools::CollapseFullPath(dir).c_str(), cdir);
  SystemTools::AddTranslationPath(cdir, dir);
}